

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdBot.cpp
# Opt level: O0

void lookForBotCommands(Comment *comment)

{
  string_view substr;
  string_view substr_00;
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar2;
  key_type *in_stack_ffffffffffffff18;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff30;
  value_type *in_stack_ffffffffffffff38;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff40;
  string local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  string local_58 [48];
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe1;
  Comment *in_stack_ffffffffffffffe8;
  size_t in_stack_fffffffffffffff0;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  substr._M_str = (char *)in_RDI;
  substr._M_len = in_stack_fffffffffffffff0;
  bVar1 = Comment::contains(in_stack_ffffffffffffffe8,substr);
  if (bVar1) {
    pVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    in_stack_ffffffffffffffd8 = pVar2.first._M_node;
    in_stack_ffffffffffffffe0 = pVar2.second;
    saveData();
    std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    Reddit::comment((Reddit *)in_stack_ffffffffffffffe8,
                    (string *)CONCAT71(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0),
                    (string *)in_stack_ffffffffffffffd8._M_node);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(in_stack_ffffffffffffff20);
    std::__cxx11::string::~string(local_58);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_RDI,in_stack_ffffffffffffff28);
  substr_00._M_str = (char *)in_RDI;
  substr_00._M_len = in_stack_fffffffffffffff0;
  bVar1 = Comment::contains(in_stack_ffffffffffffffe8,substr_00);
  if (bVar1) {
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    saveData();
    in_RDI = in_RDI + 10;
    std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    Reddit::comment((Reddit *)in_stack_ffffffffffffffe8,
                    (string *)CONCAT71(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0),
                    (string *)in_stack_ffffffffffffffd8._M_node);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)in_RDI);
    std::__cxx11::string::~string(local_a8);
  }
  return;
}

Assistant:

void lookForBotCommands(const Comment& comment) {
    if (comment.contains("!std ignore_me")) {
        ignoredUsers.insert(comment.author);
        saveData();
        reddit->comment(comment.fullName, "Alright, not following you anymore" + signature);
    }

    if (comment.contains("!std follow_me")) {
        ignoredUsers.erase(comment.author);
        saveData();
        reddit->comment(comment.fullName, "Happy to follow you again" + signature);
    }
}